

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script_tests.cpp
# Opt level: O2

void __thiscall script_tests::script_CHECKMULTISIG12::test_method(script_CHECKMULTISIG12 *this)

{
  long lVar1;
  bool bVar2;
  readonly_property<bool> rVar3;
  CScript *pCVar4;
  iterator in_R8;
  iterator pvVar5;
  iterator in_R9;
  iterator pvVar6;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  span<const_std::byte,_18446744073709551615UL> b;
  span<const_std::byte,_18446744073709551615UL> b_00;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  check_type cVar7;
  undefined1 *local_3e0;
  undefined1 *local_3d8;
  char *local_3d0;
  char *local_3c8;
  char *local_3c0;
  char *local_3b8;
  char *local_3b0;
  char *local_3a8;
  assertion_result local_3a0;
  undefined1 *local_388;
  undefined1 *local_380;
  char *local_378;
  char *local_370;
  char *local_368;
  char *local_360;
  undefined1 *local_358;
  undefined1 *local_350;
  char *local_348;
  char *local_340;
  char *local_338;
  char *local_330;
  undefined1 *local_328;
  undefined1 *local_320;
  char *local_318;
  char *local_310;
  char *local_308;
  char *local_300;
  undefined1 *local_2f8;
  undefined1 *local_2f0;
  char *local_2e8;
  char *local_2e0;
  char *local_2d8;
  char *local_2d0;
  undefined1 *local_2c8;
  undefined1 *local_2c0;
  char *local_2b8;
  char *local_2b0;
  char *local_2a8;
  char *local_2a0;
  undefined1 *local_298;
  undefined1 *local_290;
  char *local_288;
  char *local_280;
  char *local_278;
  char *local_270;
  undefined1 *local_268;
  undefined1 *local_260;
  char *local_258;
  char *local_250;
  CMutableTransaction txTo12;
  CKey key3;
  CKey key2;
  CKey key1;
  ScriptError err;
  undefined1 local_1d8 [16];
  shared_count asStack_1c8 [2];
  CScript badsig1;
  CScript goodsig2;
  undefined1 local_178 [24];
  pointer pCStack_160;
  pointer local_158;
  CScript goodsig1;
  CTransaction txFrom12;
  CScript scriptPubKey12;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  GenerateRandomKey(SUB81(&key1,0));
  GenerateRandomKey(false);
  GenerateRandomKey(SUB81(&key3,0));
  scriptPubKey12.super_CScriptBase._union._16_8_ = 0;
  scriptPubKey12.super_CScriptBase._24_8_ = 0;
  scriptPubKey12.super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
  scriptPubKey12.super_CScriptBase._union._8_8_ = 0;
  pCVar4 = CScript::operator<<(&scriptPubKey12,OP_1);
  CKey::GetPubKey((CPubKey *)&txFrom12,&key1);
  ToByteVector<CPubKey>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&txTo12,(CPubKey *)&txFrom12);
  b._M_extent._M_extent_value =
       (long)txTo12.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)txTo12.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_start;
  b._M_ptr = (pointer)txTo12.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                      super__Vector_impl_data._M_start;
  pCVar4 = CScript::operator<<(pCVar4,b);
  CKey::GetPubKey((CPubKey *)local_178,&key2);
  ToByteVector<CPubKey>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&goodsig1,(CPubKey *)local_178
            );
  b_00._M_extent._M_extent_value =
       goodsig1.super_CScriptBase._union._8_8_ - goodsig1.super_CScriptBase._union._0_8_;
  b_00._M_ptr = (pointer)goodsig1.super_CScriptBase._union.indirect_contents.indirect;
  pCVar4 = CScript::operator<<(pCVar4,b_00);
  pCVar4 = CScript::operator<<(pCVar4,OP_2);
  CScript::operator<<(pCVar4,OP_CHECKMULTISIG);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&goodsig1);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&txTo12);
  BuildCreditingTransaction((CMutableTransaction *)local_178,&scriptPubKey12,0);
  CTransaction::CTransaction(&txFrom12,(CMutableTransaction *)local_178);
  CMutableTransaction::~CMutableTransaction((CMutableTransaction *)local_178);
  local_178._16_8_ = (pointer)0x0;
  pCStack_160 = (pointer)0x0;
  local_178._0_8_ = (pointer)0x0;
  local_178._8_8_ = (pointer)0x0;
  goodsig1.super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
  goodsig1.super_CScriptBase._union._8_8_ = 0;
  goodsig1.super_CScriptBase._union._16_8_ = 0;
  BuildSpendingTransaction(&txTo12,(CScript *)local_178,(CScriptWitness *)&goodsig1,&txFrom12);
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::~vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             *)&goodsig1);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_178);
  CTransaction::CTransaction((CTransaction *)local_178,&txTo12);
  sign_multisig(&goodsig1,&scriptPubKey12,&key1,(CTransaction *)local_178);
  CTransaction::~CTransaction((CTransaction *)local_178);
  local_258 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
  ;
  local_250 = "";
  local_268 = &boost::unit_test::basic_cstring<char_const>::null;
  local_260 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  file.m_end = (iterator)0x41a;
  file.m_begin = (iterator)&local_258;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_268,msg);
  local_178._0_8_ = &PTR_CheckECDSASignature_0113c5e0;
  local_178._8_8_ = &txTo12;
  local_178._16_8_ = (pointer)0x0;
  pCStack_160 = (pointer)(txFrom12.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                          super__Vector_impl_data._M_start)->nValue;
  local_158 = (pointer)0x0;
  bVar2 = VerifyScript(&goodsig1,&scriptPubKey12,(CScriptWitness *)0x0,3,
                       (BaseSignatureChecker *)local_178,&err);
  badsig1.super_CScriptBase._union.direct[0] = bVar2;
  badsig1.super_CScriptBase._union._8_8_ = 0;
  badsig1.super_CScriptBase._union._16_8_ = 0;
  local_1d8._0_8_ =
       "VerifyScript(goodsig1, scriptPubKey12, nullptr, gFlags, MutableTransactionSignatureChecker(&txTo12, 0, txFrom12.vout[0].nValue, MissingDataBehavior::ASSERT_FAIL), &err)"
  ;
  local_1d8._8_8_ = "";
  goodsig2.super_CScriptBase._union.direct[8] = '\0';
  goodsig2.super_CScriptBase._union.indirect_contents.indirect = "<W\x1b";
  goodsig2.super_CScriptBase._union._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_278 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
  ;
  local_270 = "";
  pvVar5 = &DAT_00000001;
  pvVar6 = (iterator)0x0;
  goodsig2.super_CScriptBase._24_8_ = local_1d8;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&badsig1,(lazy_ostream *)&goodsig2,1,0,WARN,_cVar7,
             (size_t)&local_278,0x41a);
  boost::detail::shared_count::~shared_count
            ((shared_count *)((long)&badsig1.super_CScriptBase._union + 0x10));
  local_288 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
  ;
  local_280 = "";
  local_298 = &boost::unit_test::basic_cstring<char_const>::null;
  local_290 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_00.m_end = pvVar6;
  msg_00.m_begin = pvVar5;
  file_00.m_end = (iterator)0x41b;
  file_00.m_begin = (iterator)&local_288;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_298,
             msg_00);
  badsig1.super_CScriptBase._union.direct[0] = err == SCRIPT_ERR_OK;
  badsig1.super_CScriptBase._union._8_8_ = 0;
  badsig1.super_CScriptBase._union._16_8_ = 0;
  ScriptErrorString_abi_cxx11_((string *)&goodsig2,err);
  local_178._8_8_ = local_178._8_8_ & 0xffffffffffffff00;
  local_178._0_8_ = &PTR__lazy_ostream_01139e30;
  local_178._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_2a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
  ;
  local_2a0 = "";
  pvVar5 = &DAT_00000001;
  pvVar6 = &DAT_00000001;
  pCStack_160 = (pointer)&goodsig2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&badsig1,(lazy_ostream *)local_178,1,1,WARN,_cVar7,
             (size_t)&local_2a8,0x41b);
  std::__cxx11::string::~string((string *)&goodsig2);
  boost::detail::shared_count::~shared_count
            ((shared_count *)((long)&badsig1.super_CScriptBase._union + 0x10));
  (txTo12.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start)->nValue = 2;
  local_2b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
  ;
  local_2b0 = "";
  local_2c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2c0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_01.m_end = pvVar6;
  msg_01.m_begin = pvVar5;
  file_01.m_end = (iterator)0x41d;
  file_01.m_begin = (iterator)&local_2b8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_2c8,
             msg_01);
  local_178._0_8_ = &PTR_CheckECDSASignature_0113c5e0;
  local_178._8_8_ = &txTo12;
  local_178._16_8_ = (pointer)0x0;
  pCStack_160 = (pointer)(txFrom12.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                          super__Vector_impl_data._M_start)->nValue;
  local_158 = (pointer)0x0;
  bVar2 = VerifyScript(&goodsig1,&scriptPubKey12,(CScriptWitness *)0x0,3,
                       (BaseSignatureChecker *)local_178,&err);
  badsig1.super_CScriptBase._union.direct[0] = !bVar2;
  badsig1.super_CScriptBase._union._8_8_ = 0;
  badsig1.super_CScriptBase._union._16_8_ = 0;
  local_1d8._0_8_ =
       "!VerifyScript(goodsig1, scriptPubKey12, nullptr, gFlags, MutableTransactionSignatureChecker(&txTo12, 0, txFrom12.vout[0].nValue, MissingDataBehavior::ASSERT_FAIL), &err)"
  ;
  local_1d8._8_8_ = "";
  goodsig2.super_CScriptBase._union.direct[8] = '\0';
  goodsig2.super_CScriptBase._union.indirect_contents.indirect = "<W\x1b";
  goodsig2.super_CScriptBase._union._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_2d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
  ;
  local_2d0 = "";
  pvVar5 = &DAT_00000001;
  pvVar6 = (iterator)0x0;
  goodsig2.super_CScriptBase._24_8_ = local_1d8;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&badsig1,(lazy_ostream *)&goodsig2,1,0,WARN,_cVar7,
             (size_t)&local_2d8,0x41d);
  boost::detail::shared_count::~shared_count
            ((shared_count *)((long)&badsig1.super_CScriptBase._union + 0x10));
  local_2e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
  ;
  local_2e0 = "";
  local_2f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2f0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_02.m_end = pvVar6;
  msg_02.m_begin = pvVar5;
  file_02.m_end = (iterator)0x41e;
  file_02.m_begin = (iterator)&local_2e8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_2f8,
             msg_02);
  badsig1.super_CScriptBase._union.direct[0] = err == SCRIPT_ERR_EVAL_FALSE;
  badsig1.super_CScriptBase._union._8_8_ = 0;
  badsig1.super_CScriptBase._union._16_8_ = 0;
  ScriptErrorString_abi_cxx11_((string *)&goodsig2,err);
  local_178._8_8_ = local_178._8_8_ & 0xffffffffffffff00;
  local_178._0_8_ = &PTR__lazy_ostream_01139e30;
  local_178._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_308 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
  ;
  local_300 = "";
  pvVar5 = &DAT_00000001;
  pvVar6 = &DAT_00000001;
  pCStack_160 = (pointer)&goodsig2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&badsig1,(lazy_ostream *)local_178,1,1,WARN,_cVar7,
             (size_t)&local_308,0x41e);
  std::__cxx11::string::~string((string *)&goodsig2);
  boost::detail::shared_count::~shared_count
            ((shared_count *)((long)&badsig1.super_CScriptBase._union + 0x10));
  CTransaction::CTransaction((CTransaction *)local_178,&txTo12);
  sign_multisig(&goodsig2,&scriptPubKey12,&key2,(CTransaction *)local_178);
  CTransaction::~CTransaction((CTransaction *)local_178);
  local_318 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
  ;
  local_310 = "";
  local_328 = &boost::unit_test::basic_cstring<char_const>::null;
  local_320 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_03.m_end = pvVar6;
  msg_03.m_begin = pvVar5;
  file_03.m_end = (iterator)0x421;
  file_03.m_begin = (iterator)&local_318;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_328,
             msg_03);
  local_178._0_8_ = &PTR_CheckECDSASignature_0113c5e0;
  local_178._16_8_ = (pointer)0x0;
  pCStack_160 = (pointer)(txFrom12.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                          super__Vector_impl_data._M_start)->nValue;
  local_158 = (pointer)0x0;
  local_178._8_8_ = (pointer)&txTo12;
  rVar3.super_class_property<bool>.value =
       (class_property<bool>)
       VerifyScript(&goodsig2,&scriptPubKey12,(CScriptWitness *)0x0,3,
                    (BaseSignatureChecker *)local_178,&err);
  local_1d8._8_8_ = (element_type *)0x0;
  asStack_1c8[0].pi_ = (sp_counted_base *)0x0;
  badsig1.super_CScriptBase._24_8_ = &local_3a0;
  local_3a0._0_8_ =
       "VerifyScript(goodsig2, scriptPubKey12, nullptr, gFlags, MutableTransactionSignatureChecker(&txTo12, 0, txFrom12.vout[0].nValue, MissingDataBehavior::ASSERT_FAIL), &err)"
  ;
  local_3a0.m_message.px = (element_type *)0xbcd1f3;
  badsig1.super_CScriptBase._union._8_8_ =
       badsig1.super_CScriptBase._union._8_8_ & 0xffffffffffffff00;
  badsig1.super_CScriptBase._union.indirect_contents.indirect = "<W\x1b";
  badsig1.super_CScriptBase._union._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_338 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
  ;
  local_330 = "";
  pvVar5 = &DAT_00000001;
  pvVar6 = (iterator)0x0;
  local_1d8[0] = rVar3.super_class_property<bool>.value;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1d8,(lazy_ostream *)&badsig1,1,0,WARN,_cVar7,
             (size_t)&local_338,0x421);
  boost::detail::shared_count::~shared_count(asStack_1c8);
  local_348 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
  ;
  local_340 = "";
  local_358 = &boost::unit_test::basic_cstring<char_const>::null;
  local_350 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_04.m_end = pvVar6;
  msg_04.m_begin = pvVar5;
  file_04.m_end = (iterator)0x422;
  file_04.m_begin = (iterator)&local_348;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_358,
             msg_04);
  local_1d8[0] = (class_property<bool>)(class_property<bool>)(err == SCRIPT_ERR_OK);
  local_1d8._8_8_ = (element_type *)0x0;
  asStack_1c8[0].pi_ = (sp_counted_base *)0x0;
  ScriptErrorString_abi_cxx11_((string *)&badsig1,err);
  local_178._8_8_ = local_178._8_8_ & 0xffffffffffffff00;
  local_178._0_8_ = &PTR__lazy_ostream_01139e30;
  local_178._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_368 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
  ;
  local_360 = "";
  pvVar5 = &DAT_00000001;
  pvVar6 = &DAT_00000001;
  pCStack_160 = (pointer)&badsig1;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1d8,(lazy_ostream *)local_178,1,1,WARN,_cVar7,
             (size_t)&local_368,0x422);
  std::__cxx11::string::~string((string *)&badsig1);
  boost::detail::shared_count::~shared_count(asStack_1c8);
  CTransaction::CTransaction((CTransaction *)local_178,&txTo12);
  sign_multisig(&badsig1,&scriptPubKey12,&key3,(CTransaction *)local_178);
  CTransaction::~CTransaction((CTransaction *)local_178);
  local_378 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
  ;
  local_370 = "";
  local_388 = &boost::unit_test::basic_cstring<char_const>::null;
  local_380 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_05.m_end = pvVar6;
  msg_05.m_begin = pvVar5;
  file_05.m_end = (iterator)0x425;
  file_05.m_begin = (iterator)&local_378;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_388,
             msg_05);
  local_178._0_8_ = &PTR_CheckECDSASignature_0113c5e0;
  local_178._16_8_ = (pointer)0x0;
  pCStack_160 = (pointer)(txFrom12.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                          super__Vector_impl_data._M_start)->nValue;
  local_158 = (pointer)0x0;
  local_178._8_8_ = (pointer)&txTo12;
  bVar2 = VerifyScript(&badsig1,&scriptPubKey12,(CScriptWitness *)0x0,3,
                       (BaseSignatureChecker *)local_178,&err);
  local_3a0.m_message.px = (element_type *)0x0;
  local_3a0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  asStack_1c8[1].pi_ = (sp_counted_base *)&local_3b0;
  local_3b0 = 
  "!VerifyScript(badsig1, scriptPubKey12, nullptr, gFlags, MutableTransactionSignatureChecker(&txTo12, 0, txFrom12.vout[0].nValue, MissingDataBehavior::ASSERT_FAIL), &err)"
  ;
  local_3a8 = "";
  local_1d8._8_8_ = local_1d8._8_8_ & 0xffffffffffffff00;
  local_1d8._0_8_ = &PTR__lazy_ostream_0113a070;
  asStack_1c8[0].pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_3c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
  ;
  local_3b8 = "";
  pvVar5 = &DAT_00000001;
  pvVar6 = (iterator)0x0;
  local_3a0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)!bVar2;
  boost::test_tools::tt_detail::report_assertion
            (&local_3a0,(lazy_ostream *)local_1d8,1,0,WARN,_cVar7,(size_t)&local_3c0,0x425);
  boost::detail::shared_count::~shared_count(&local_3a0.m_message.pn);
  local_3d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
  ;
  local_3c8 = "";
  local_3e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3d8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_06.m_end = pvVar6;
  msg_06.m_begin = pvVar5;
  file_06.m_end = (iterator)0x426;
  file_06.m_begin = (iterator)&local_3d0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_3e0,
             msg_06);
  local_3a0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(err == SCRIPT_ERR_EVAL_FALSE);
  local_3a0.m_message.px = (element_type *)0x0;
  local_3a0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  ScriptErrorString_abi_cxx11_((string *)local_1d8,err);
  local_178._8_8_ = local_178._8_8_ & 0xffffffffffffff00;
  local_178._0_8_ = &PTR__lazy_ostream_01139e30;
  local_178._16_8_ = boost::unit_test::lazy_ostream::inst;
  pCStack_160 = (pointer)local_1d8;
  boost::test_tools::tt_detail::report_assertion
            (&local_3a0,(lazy_ostream *)local_178,1,1,WARN,0xbcb770,(size_t)&stack0xfffffffffffffc10
             ,0x426);
  std::__cxx11::string::~string((string *)local_1d8);
  boost::detail::shared_count::~shared_count(&local_3a0.m_message.pn);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&badsig1.super_CScriptBase);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&goodsig2.super_CScriptBase);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&goodsig1.super_CScriptBase);
  CMutableTransaction::~CMutableTransaction(&txTo12);
  CTransaction::~CTransaction(&txFrom12);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&scriptPubKey12.super_CScriptBase);
  std::
  unique_ptr<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  ::~unique_ptr(&key3.keydata);
  std::
  unique_ptr<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  ::~unique_ptr(&key2.keydata);
  std::
  unique_ptr<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  ::~unique_ptr(&key1.keydata);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(script_CHECKMULTISIG12)
{
    ScriptError err;
    CKey key1 = GenerateRandomKey();
    CKey key2 = GenerateRandomKey(/*compressed=*/false);
    CKey key3 = GenerateRandomKey();

    CScript scriptPubKey12;
    scriptPubKey12 << OP_1 << ToByteVector(key1.GetPubKey()) << ToByteVector(key2.GetPubKey()) << OP_2 << OP_CHECKMULTISIG;

    const CTransaction txFrom12{BuildCreditingTransaction(scriptPubKey12)};
    CMutableTransaction txTo12 = BuildSpendingTransaction(CScript(), CScriptWitness(), txFrom12);

    CScript goodsig1 = sign_multisig(scriptPubKey12, key1, CTransaction(txTo12));
    BOOST_CHECK(VerifyScript(goodsig1, scriptPubKey12, nullptr, gFlags, MutableTransactionSignatureChecker(&txTo12, 0, txFrom12.vout[0].nValue, MissingDataBehavior::ASSERT_FAIL), &err));
    BOOST_CHECK_MESSAGE(err == SCRIPT_ERR_OK, ScriptErrorString(err));
    txTo12.vout[0].nValue = 2;
    BOOST_CHECK(!VerifyScript(goodsig1, scriptPubKey12, nullptr, gFlags, MutableTransactionSignatureChecker(&txTo12, 0, txFrom12.vout[0].nValue, MissingDataBehavior::ASSERT_FAIL), &err));
    BOOST_CHECK_MESSAGE(err == SCRIPT_ERR_EVAL_FALSE, ScriptErrorString(err));

    CScript goodsig2 = sign_multisig(scriptPubKey12, key2, CTransaction(txTo12));
    BOOST_CHECK(VerifyScript(goodsig2, scriptPubKey12, nullptr, gFlags, MutableTransactionSignatureChecker(&txTo12, 0, txFrom12.vout[0].nValue, MissingDataBehavior::ASSERT_FAIL), &err));
    BOOST_CHECK_MESSAGE(err == SCRIPT_ERR_OK, ScriptErrorString(err));

    CScript badsig1 = sign_multisig(scriptPubKey12, key3, CTransaction(txTo12));
    BOOST_CHECK(!VerifyScript(badsig1, scriptPubKey12, nullptr, gFlags, MutableTransactionSignatureChecker(&txTo12, 0, txFrom12.vout[0].nValue, MissingDataBehavior::ASSERT_FAIL), &err));
    BOOST_CHECK_MESSAGE(err == SCRIPT_ERR_EVAL_FALSE, ScriptErrorString(err));
}